

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void tc_free(void *__ptr)

{
  tcmalloc::InvokeDeleteHook(__ptr);
  DebugDeallocate(__ptr,-0x10325470,0);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_free(void* ptr) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(ptr);
  DebugDeallocate(ptr, MallocBlock::kMallocType, 0);
  force_frame();
}